

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,char *apName,string *aValue)

{
  int iVar1;
  Exception *this_00;
  
  iVar1 = sqlite3_bind_parameter_index((this->mStmtPtr).mpStmt,apName);
  iVar1 = sqlite3_bind_text((this->mStmtPtr).mpStmt,iVar1,(aValue->_M_dataplus)._M_p,
                            (int)aValue->_M_string_length,(_func_void_void_ptr *)0x0);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(this->mStmtPtr).mpSQLite,iVar1);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Statement::bindNoCopy(const char* apName, const std::string& aValue)
{
    const int index = sqlite3_bind_parameter_index(mStmtPtr, apName);
    const int ret = sqlite3_bind_text(mStmtPtr, index, aValue.c_str(),
                                      static_cast<int>(aValue.size()), SQLITE_STATIC);
    check(ret);
}